

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_bind.cpp
# Opt level: O0

void Cmd_rebind(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  char *bind;
  FKeyBindings *local_28;
  FKeyBindings *bindings;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  if (key == 0) {
    Printf("Rebind cannot be used from the console\n");
  }
  else {
    if ((key & 0x8000U) == 0) {
      local_28 = &Bindings;
      bindings._4_4_ = key;
    }
    else {
      local_28 = &DoubleBindings;
      bindings._4_4_ = key & 0x7fff;
    }
    iVar1 = FCommandLine::argc(argv);
    if (1 < iVar1) {
      bind = FCommandLine::operator[](argv,1);
      FKeyBindings::SetBind(local_28,bindings._4_4_,bind);
    }
  }
  return;
}

Assistant:

CCMD (rebind)
{
	FKeyBindings *bindings;

	if (key == 0)
	{
		Printf ("Rebind cannot be used from the console\n");
		return;
	}

	if (key & KEY_DBLCLICKED)
	{
		bindings = &DoubleBindings;
		key &= KEY_DBLCLICKED-1;
	}
	else
	{
		bindings = &Bindings;
	}

	if (argv.argc() > 1)
	{
		bindings->SetBind(key, argv[1]);
	}
}